

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sample_locations_info
          (Impl *this,Value *state,VkSampleLocationsInfoEXT **out_info)

{
  bool bVar1;
  uint uVar2;
  VkSampleCountFlagBits VVar3;
  SizeType SVar4;
  VkSampleLocationsInfoEXT *pVVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar6;
  Type pGVar7;
  ConstValueIterator pGVar8;
  Type pGVar9;
  float fVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *elem;
  ConstValueIterator itr;
  VkSampleLocationEXT *locations;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *locs;
  VkSampleLocationsInfoEXT *info;
  VkSampleLocationsInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar5 = ScratchAllocator::allocate_cleared<VkSampleLocationsInfoEXT>(&this->allocator);
  pGVar6 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"sampleLocationGridSize");
  pGVar7 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar6,"width");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar7);
  (pVVar5->sampleLocationGridSize).width = uVar2;
  pGVar6 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"sampleLocationGridSize");
  pGVar7 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar6,"height");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar7);
  (pVVar5->sampleLocationGridSize).height = uVar2;
  pGVar7 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"sampleLocationsPerPixel");
  VVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar7);
  pVVar5->sampleLocationsPerPixel = VVar3;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"sampleLocations");
  if (bVar1) {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"sampleLocations");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar7);
    itr = (ConstValueIterator)
          ScratchAllocator::allocate_n<VkSampleLocationEXT>(&this->allocator,(ulong)SVar4);
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar7);
    pVVar5->sampleLocationsCount = SVar4;
    pVVar5->pSampleLocations = (VkSampleLocationEXT *)itr;
    for (elem = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Begin(pGVar7);
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::End(pGVar7), elem != pGVar8; elem = elem + 1) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)elem,"x");
      fVar10 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetFloat(pGVar9);
      (itr->data_).s.length = (SizeType)fVar10;
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)elem,"y");
      fVar10 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetFloat(pGVar9);
      (itr->data_).s.hashcode = (SizeType)fVar10;
      itr = (ConstValueIterator)((long)&itr->data_ + 8);
    }
  }
  *out_info = pVVar5;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sample_locations_info(const Value &state, VkSampleLocationsInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkSampleLocationsInfoEXT>();
	info->sampleLocationGridSize.width = state["sampleLocationGridSize"]["width"].GetUint();
	info->sampleLocationGridSize.height = state["sampleLocationGridSize"]["height"].GetUint();
	info->sampleLocationsPerPixel = static_cast<VkSampleCountFlagBits>(state["sampleLocationsPerPixel"].GetUint());

	if (state.HasMember("sampleLocations"))
	{
		auto &locs = state["sampleLocations"];
		auto *locations = allocator.allocate_n<VkSampleLocationEXT>(locs.Size());
		info->sampleLocationsCount = uint32_t(locs.Size());
		info->pSampleLocations = locations;

		for (auto itr = locs.Begin(); itr != locs.End(); ++itr)
		{
			auto &elem = *itr;
			locations->x = elem["x"].GetFloat();
			locations->y = elem["y"].GetFloat();
			locations++;
		}
	}

	*out_info = info;
	return true;
}